

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Model.cpp
# Opt level: O3

bool __thiscall iDynTree::Model::isJointNameUsed(Model *this,string *jointName)

{
  size_t __n;
  int iVar1;
  ulong uVar2;
  size_type *psVar3;
  long lVar4;
  ulong uVar5;
  bool bVar6;
  
  lVar4 = (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(this->joints).
                super__Vector_base<iDynTree::IJoint_*,_std::allocator<iDynTree::IJoint_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  if (lVar4 == 0) {
    bVar6 = false;
  }
  else {
    uVar5 = lVar4 >> 3;
    __n = jointName->_M_string_length;
    psVar3 = &((this->jointNames).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start)->_M_string_length;
    bVar6 = true;
    uVar2 = 1;
    do {
      if (__n == *psVar3) {
        if (__n == 0) {
          return bVar6;
        }
        iVar1 = bcmp((jointName->_M_dataplus)._M_p,
                     (((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                      (psVar3 + -1))->_M_dataplus)._M_p,__n);
        if (iVar1 == 0) {
          return bVar6;
        }
      }
      bVar6 = uVar2 < uVar5;
      lVar4 = uVar2 + (-(ulong)(uVar5 == 0) - uVar5);
      uVar2 = uVar2 + 1;
      psVar3 = psVar3 + 4;
    } while (lVar4 != 0);
  }
  return bVar6;
}

Assistant:

bool Model::isJointNameUsed(const std::string jointName) const
{
    for(size_t i=0; i < this->getNrOfJoints(); i++ )
    {
        if( jointName == jointNames[i] )
        {
            return true;
        }
    }

    return false;
}